

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-homedir.c
# Opt level: O0

int run_test_homedir(void)

{
  int iVar1;
  size_t sVar2;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  size_t sStack_1020;
  int r;
  size_t len;
  char homedir [4096];
  
  sStack_1020 = 0x1000;
  len._0_1_ = '\0';
  sVar2 = strlen((char *)&len);
  if (sVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x25,"strlen(homedir)","==","0",sVar2,"==",0);
    abort();
  }
  iVar1 = uv_os_homedir(&len,&stack0xffffffffffffefe0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x27,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  sVar2 = strlen((char *)&len);
  if (sVar2 != sStack_1020) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x28,"strlen(homedir)","==","len",sVar2,"==",sStack_1020);
    abort();
  }
  if ((long)sStack_1020 < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x29,"len",">","0",sStack_1020,">",0);
    abort();
  }
  if ((long)homedir[sStack_1020 - 8] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x2a,"homedir[len]","==","\'\\0\'",(long)homedir[sStack_1020 - 8],"==",0);
    abort();
  }
  if (sStack_1020 == 1) {
    if ((long)(char)len != 0x2f) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
              ,0x33,"homedir[0]","==","\'/\'",(long)(char)len,"==",0x2f);
      abort();
    }
  }
  else if (*(char *)((long)&r + sStack_1020 + 3) == '/') {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x35,"homedir[len - 1]","!=","\'/\'",0x2f,"!=",0x2f);
    abort();
  }
  sStack_1020 = 1;
  iVar1 = uv_os_homedir(&len,&stack0xffffffffffffefe0);
  if ((long)iVar1 != -0x69) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x3b,"r","==","UV_ENOBUFS",(long)iVar1,"==",0xffffffffffffff97);
    abort();
  }
  if ((long)sStack_1020 < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x3c,"len",">","1",sStack_1020,">",1);
    abort();
  }
  iVar1 = uv_os_homedir(0,&stack0xffffffffffffefe0);
  if ((long)iVar1 == -0x16) {
    iVar1 = uv_os_homedir(&len,0);
    if ((long)iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
              ,0x42,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
      abort();
    }
    sStack_1020 = 0;
    iVar1 = uv_os_homedir(&len,&stack0xffffffffffffefe0);
    if ((long)iVar1 == -0x16) {
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
            ,0x45,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-homedir.c"
          ,0x40,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
  abort();
}

Assistant:

TEST_IMPL(homedir) {
  char homedir[PATHMAX];
  size_t len;
  int r;

  /* Test the normal case */
  len = sizeof homedir;
  homedir[0] = '\0';
  ASSERT_OK(strlen(homedir));
  r = uv_os_homedir(homedir, &len);
  ASSERT_OK(r);
  ASSERT_EQ(strlen(homedir), len);
  ASSERT_GT(len, 0);
  ASSERT_EQ(homedir[len], '\0');

#ifdef _WIN32
  if (len == 3 && homedir[1] == ':')
    ASSERT_EQ(homedir[2], '\\');
  else
    ASSERT_NE(homedir[len - 1], '\\');
#else
  if (len == 1)
    ASSERT_EQ(homedir[0], '/');
  else
    ASSERT_NE(homedir[len - 1], '/');
#endif

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_homedir(homedir, &len);
  ASSERT_EQ(r, UV_ENOBUFS);
  ASSERT_GT(len, SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_homedir(NULL, &len);
  ASSERT_EQ(r, UV_EINVAL);
  r = uv_os_homedir(homedir, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  len = 0;
  r = uv_os_homedir(homedir, &len);
  ASSERT_EQ(r, UV_EINVAL);

  return 0;
}